

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::CheckArgument(cmCTest *this,string *arg,char *varg1,char *varg2)

{
  bool bVar1;
  bool local_2a;
  char *varg2_local;
  char *varg1_local;
  string *arg_local;
  cmCTest *this_local;
  
  if ((varg1 != (char *)0x0) && (bVar1 = std::operator==(arg,varg1), bVar1)) {
    return true;
  }
  local_2a = false;
  if (varg2 != (char *)0x0) {
    local_2a = std::operator==(arg,varg2);
  }
  return local_2a;
}

Assistant:

bool cmCTest::CheckArgument(const std::string& arg, const char* varg1,
  const char* varg2)
{
  return (varg1 && arg == varg1) || (varg2 && arg == varg2);
}